

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O2

if2ip_result_t Curl_if2ip(int af,uint remote_scope,uint param_3,char *interf,char *buf,int buf_size)

{
  sockaddr *sa;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ifaddrs *piVar4;
  if2ip_result_t iVar5;
  char scope [12];
  ifaddrs *head;
  char ipstr [64];
  
  piVar4 = (ifaddrs *)&head;
  iVar1 = getifaddrs(piVar4);
  if (iVar1 < 0) {
    iVar5 = IF2IP_NOT_FOUND;
  }
  else {
    iVar5 = IF2IP_NOT_FOUND;
    while( true ) {
      piVar4 = piVar4->ifa_next;
      if (piVar4 == (ifaddrs *)0x0) break;
      if (piVar4->ifa_addr != (sockaddr *)0x0) {
        if ((uint)piVar4->ifa_addr->sa_family == af) {
          iVar1 = curl_strequal(piVar4->ifa_name,interf);
          if (iVar1 != 0) {
            scope[0] = '\0';
            scope[1] = '\0';
            scope[2] = '\0';
            scope[3] = '\0';
            scope[4] = '\0';
            scope[5] = '\0';
            scope[6] = '\0';
            scope[7] = '\0';
            scope[8] = '\0';
            scope[9] = '\0';
            scope[10] = '\0';
            scope[0xb] = '\0';
            sa = piVar4->ifa_addr;
            if (af != 10) {
              pcVar3 = sa->sa_data + 2;
LAB_005d5992:
              pcVar3 = inet_ntop(af,pcVar3,ipstr,0x40);
              curl_msnprintf(buf,(long)buf_size,"%s%s",pcVar3,scope);
              iVar5 = IF2IP_FOUND;
              break;
            }
            uVar2 = Curl_ipv6_scope(sa);
            if (uVar2 == remote_scope) {
              if ((param_3 == 0) || (*(uint *)(sa[1].sa_data + 6) == param_3)) {
                pcVar3 = sa->sa_data + 6;
                if (*(uint *)(sa[1].sa_data + 6) != 0) {
                  curl_msnprintf(scope,0xc,"%%%u");
                }
                goto LAB_005d5992;
              }
            }
            iVar5 = IF2IP_AF_NOT_SUPPORTED;
          }
        }
        else if (iVar5 == IF2IP_NOT_FOUND) {
          iVar1 = curl_strequal(piVar4->ifa_name,interf);
          iVar5 = (if2ip_result_t)(iVar1 != 0);
        }
      }
    }
    freeifaddrs(head);
  }
  return iVar5;
}

Assistant:

if2ip_result_t Curl_if2ip(int af,
#ifdef ENABLE_IPV6
                          unsigned int remote_scope,
                          unsigned int local_scope_id,
#endif
                          const char *interf,
                          char *buf, int buf_size)
{
  struct ifaddrs *iface, *head;
  if2ip_result_t res = IF2IP_NOT_FOUND;

#if defined(ENABLE_IPV6) && \
    !defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  (void) local_scope_id;
#endif

  if(getifaddrs(&head) >= 0) {
    for(iface = head; iface != NULL; iface = iface->ifa_next) {
      if(iface->ifa_addr) {
        if(iface->ifa_addr->sa_family == af) {
          if(strcasecompare(iface->ifa_name, interf)) {
            void *addr;
            const char *ip;
            char scope[12] = "";
            char ipstr[64];
#ifdef ENABLE_IPV6
            if(af == AF_INET6) {
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              unsigned int scopeid = 0;
#endif
              unsigned int ifscope = Curl_ipv6_scope(iface->ifa_addr);

              if(ifscope != remote_scope) {
                /* We are interested only in interface addresses whose scope
                   matches the remote address we want to connect to: global
                   for global, link-local for link-local, etc... */
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;
                continue;
              }

              addr =
                &((struct sockaddr_in6 *)(void *)iface->ifa_addr)->sin6_addr;
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              /* Include the scope of this interface as part of the address */
              scopeid = ((struct sockaddr_in6 *)(void *)iface->ifa_addr)
                            ->sin6_scope_id;

              /* If given, scope id should match. */
              if(local_scope_id && scopeid != local_scope_id) {
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;

                continue;
              }

              if(scopeid)
                msnprintf(scope, sizeof(scope), "%%%u", scopeid);
#endif
            }
            else
#endif
              addr =
                &((struct sockaddr_in *)(void *)iface->ifa_addr)->sin_addr;
            res = IF2IP_FOUND;
            ip = Curl_inet_ntop(af, addr, ipstr, sizeof(ipstr));
            msnprintf(buf, buf_size, "%s%s", ip, scope);
            break;
          }
        }
        else if((res == IF2IP_NOT_FOUND) &&
                strcasecompare(iface->ifa_name, interf)) {
          res = IF2IP_AF_NOT_SUPPORTED;
        }
      }
    }

    freeifaddrs(head);
  }

  return res;
}